

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  byte bVar1;
  pointer paVar2;
  type_info *tp;
  void *__ptr;
  uint __val;
  _Alloc_hider _Var3;
  uint uVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  type_info *ptVar10;
  function_record *pfVar11;
  PyMethodDef *pPVar12;
  object *poVar13;
  PyObject *pPVar14;
  long *plVar15;
  PyObject *pPVar16;
  ulong uVar17;
  PyTypeObject *pPVar18;
  function_record *pfVar19;
  ulong uVar20;
  size_type *psVar21;
  object *object;
  long lVar22;
  long lVar23;
  function_record *pfVar24;
  char cVar25;
  long lVar26;
  uint __len;
  function_record *value;
  pointer paVar27;
  bool bVar28;
  string signatures;
  capsule rec_capsule_1;
  object scope_module;
  string signature;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  PyBufferProcs *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  function_record *local_a0;
  cpp_function *local_98;
  function_record *local_90;
  handle local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_60;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_40;
  PyBufferProcs *local_38;
  
  pcVar9 = "";
  if (rec->name != (char *)0x0) {
    pcVar9 = rec->name;
  }
  local_98 = this;
  local_90 = (function_record *)types;
  local_38 = (PyBufferProcs *)args;
  pcVar9 = strdup(pcVar9);
  rec->name = pcVar9;
  if (rec->doc != (char *)0x0) {
    pcVar9 = strdup(rec->doc);
    rec->doc = pcVar9;
  }
  paVar27 = (rec->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = rec;
  if (paVar27 != paVar2) {
    do {
      if (*(char **)paVar27 != (char *)0x0) {
        pcVar9 = strdup(*(char **)paVar27);
        *(char **)paVar27 = pcVar9;
      }
      if (*(char **)(paVar27 + 8) == (char *)0x0) {
        if (*(long *)(paVar27 + 0x10) != 0) {
          local_e8._8_8_ = *(undefined8 *)(paVar27 + 0x10);
          local_d8._0_8_ = "__repr__";
          local_d8._8_8_ = 0;
          detail::
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
          operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                      *)&local_c0);
          cast<std::__cxx11::string>(&local_60,(pybind11 *)&local_c0,object);
          _Var3._M_p = local_60._M_dataplus._M_p;
          pcVar9 = strdup(local_60._M_dataplus._M_p);
          *(char **)(paVar27 + 8) = pcVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != &local_60.field_2) {
            operator_delete(_Var3._M_p,
                            CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                     local_60.field_2._M_local_buf[0]) + 1);
          }
          pybind11::object::~object((object *)&local_c0);
          pybind11::object::~object((object *)(local_d8 + 8));
        }
      }
      else {
        pcVar9 = strdup(*(char **)(paVar27 + 8));
        *(char **)(paVar27 + 8) = pcVar9;
      }
      paVar27 = paVar27 + 0x20;
    } while (paVar27 != paVar2);
  }
  local_40 = &local_a0->args;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_c8 = (PyBufferProcs *)0x0;
  lVar22 = 0;
  lVar23 = 0;
  lVar26 = 0;
  do {
    bVar1 = text[lVar23];
    lVar23 = lVar23 + 1;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0) {
        bVar28 = false;
      }
      else if (bVar1 == 0x25) {
        tp = *(type_info **)((long)local_90 + lVar22 * 8);
        if (tp == (type_info *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        ptVar10 = detail::get_type_info(tp,false);
        lVar22 = lVar22 + 1;
        if (ptVar10 == (type_info *)0x0) {
          std::__cxx11::string::string
                    ((string *)local_e8,*(char **)(tp + 8) + (**(char **)(tp + 8) == '*'),
                     (allocator *)&local_c0);
          detail::clean_type_id((string *)local_e8);
          std::__cxx11::string::_M_append((char *)&local_60,local_e8._0_8_);
          if ((PyTypeObject *)local_e8._0_8_ != (PyTypeObject *)local_d8) {
            operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
          }
          goto LAB_003d5225;
        }
        bVar28 = true;
        std::__cxx11::string::append((char *)&local_60);
      }
      else {
LAB_003d502c:
        bVar28 = true;
        std::__cxx11::string::push_back((char)&local_60);
      }
    }
    else if (bVar1 == 0x7d) {
      bVar28 = true;
      lVar26 = lVar26 + -1;
      if (lVar26 == 0) {
        paVar27 = (local_a0->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((local_c8 <
             (PyBufferProcs *)
             ((long)(local_a0->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar27 >> 5)) &&
           (*(long *)(paVar27 + (long)local_c8 * 0x20 + 8) != 0)) {
          std::__cxx11::string::append((char *)&local_60);
          std::__cxx11::string::append((char *)&local_60);
        }
        local_c8 = (PyBufferProcs *)((long)&local_c8->bf_getbuffer + 1);
        lVar26 = 0;
      }
    }
    else {
      if (bVar1 != 0x7b) goto LAB_003d502c;
      if ((lVar26 == 0) && (local_c8 < local_38 && text[lVar23] != '*')) {
        paVar27 = (local_a0->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((paVar27 ==
              (local_a0->args).
              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              ._M_impl.super__Vector_impl_data._M_finish) ||
            (*(long *)(paVar27 + (long)local_c8 * 0x20) == 0)) &&
           ((local_c8 != (PyBufferProcs *)0x0 || ((local_a0->field_0x59 & 0x20) == 0)))) {
          uVar20 = (long)local_c8 - (ulong)(((byte)local_a0->field_0x59 >> 5 & 1) != 0);
          cVar25 = '\x01';
          if (9 < uVar20) {
            uVar17 = uVar20;
            cVar5 = '\x04';
            do {
              cVar25 = cVar5;
              if (uVar17 < 100) {
                cVar25 = cVar25 + -2;
                goto LAB_003d513d;
              }
              if (uVar17 < 1000) {
                cVar25 = cVar25 + -1;
                goto LAB_003d513d;
              }
              if (uVar17 < 10000) goto LAB_003d513d;
              bVar28 = 99999 < uVar17;
              uVar17 = uVar17 / 10000;
              cVar5 = cVar25 + '\x04';
            } while (bVar28);
            cVar25 = cVar25 + '\x01';
          }
LAB_003d513d:
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_c0,cVar25);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_c0._M_dataplus._M_p,(uint)local_c0._M_string_length,uVar20);
          plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x5fd251);
          local_e8._0_8_ = local_d8;
          pPVar18 = (PyTypeObject *)(plVar15 + 2);
          if ((PyTypeObject *)*plVar15 == pPVar18) {
            local_d8._0_8_ = (pPVar18->ob_base).ob_base.ob_refcnt;
            local_d8._8_8_ = plVar15[3];
          }
          else {
            local_d8._0_8_ = (pPVar18->ob_base).ob_base.ob_refcnt;
            local_e8._0_8_ = (PyTypeObject *)*plVar15;
          }
          local_e8._8_8_ = plVar15[1];
          *plVar15 = (long)pPVar18;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_60,local_e8._0_8_);
          if ((PyTypeObject *)local_e8._0_8_ != (PyTypeObject *)local_d8) {
            operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)&local_60);
        }
        std::__cxx11::string::append((char *)&local_60);
      }
      lVar26 = lVar26 + 1;
LAB_003d5225:
      bVar28 = true;
    }
  } while (bVar28);
  if ((lVar26 != 0) || (*(type_info **)((long)local_90 + lVar22 * 8) != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar9 = strdup(local_60._M_dataplus._M_p);
  value = local_a0;
  local_a0->signature = pcVar9;
  if ((local_a0->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (local_a0->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_40);
  }
  pcVar9 = value->name;
  iVar6 = strcmp(pcVar9,"__init__");
  if (iVar6 == 0) {
    bVar28 = true;
  }
  else {
    iVar6 = strcmp(pcVar9,"__setstate__");
    bVar28 = iVar6 == 0;
  }
  value->field_0x59 = value->field_0x59 & 0xfe | bVar28;
  value->nargs = (uint16_t)local_38;
  pPVar14 = (value->sibling).m_ptr;
  if (pPVar14 == (PyObject *)0x0) {
LAB_003d5342:
    pfVar24 = (function_record *)0x0;
  }
  else {
    pPVar18 = pPVar14->ob_type;
    if ((pPVar18 != (PyTypeObject *)&PyCFunction_Type) &&
       (iVar6 = PyType_IsSubtype(pPVar18,&PyCFunction_Type), iVar6 == 0)) {
      if (((value->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*value->name != '_')) {
        std::__cxx11::string::string((string *)&local_80,value->name,(allocator *)&local_88);
        std::operator+(&local_c0,"Cannot overload existing non-function object \"",&local_80);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_e8._0_8_ = *plVar15;
        psVar21 = (size_type *)(plVar15 + 2);
        if ((size_type *)local_e8._0_8_ == psVar21) {
          local_d8._0_8_ = *psVar21;
          local_d8._8_8_ = plVar15[3];
          local_e8._0_8_ = local_d8;
        }
        else {
          local_d8._0_8_ = *psVar21;
        }
        local_e8._8_8_ = plVar15[1];
        *plVar15 = (long)psVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        pybind11_fail((string *)local_e8);
      }
      goto LAB_003d5342;
    }
    pPVar14 = (value->sibling).m_ptr;
    if ((*(byte *)(pPVar14[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_e8._0_8_ = pPVar14[1].ob_type;
    }
    else {
      local_e8._0_8_ = (PyTypeObject *)0x0;
    }
    if ((PyTypeObject *)local_e8._0_8_ != (PyTypeObject *)0x0) {
      (((PyTypeObject *)local_e8._0_8_)->ob_base).ob_base.ob_refcnt =
           (((PyTypeObject *)local_e8._0_8_)->ob_base).ob_base.ob_refcnt + 1;
    }
    pfVar11 = capsule::operator_cast_to_function_record_((capsule *)local_e8);
    pfVar24 = (function_record *)0x0;
    if ((pfVar11->scope).m_ptr == (value->scope).m_ptr) {
      pfVar24 = pfVar11;
    }
    pybind11::object::~object((object *)local_e8);
  }
  if (pfVar24 != (function_record *)0x0) {
    pPVar14 = (value->sibling).m_ptr;
    (local_98->super_function).super_object.super_handle.m_ptr = pPVar14;
    pfVar11 = pfVar24;
    if (pPVar14 != (PyObject *)0x0) {
      pPVar14->ob_refcnt = pPVar14->ob_refcnt + 1;
    }
    do {
      pfVar19 = pfVar11;
      pfVar11 = pfVar19->next;
    } while (pfVar11 != (function_record *)0x0);
    pfVar19->next = value;
    pfVar11 = pfVar24;
    goto LAB_003d54b7;
  }
  pPVar12 = (PyMethodDef *)operator_new(0x20);
  *(undefined8 *)&pPVar12->ml_flags = 0;
  pPVar12->ml_doc = (char *)0x0;
  pPVar12->ml_name = (char *)0x0;
  pPVar12->ml_meth = (PyCFunction)0x0;
  value->def = pPVar12;
  *(undefined8 *)&pPVar12->ml_flags = 0;
  pPVar12->ml_doc = (char *)0x0;
  pPVar12->ml_name = (char *)0x0;
  pPVar12->ml_meth = (PyCFunction)0x0;
  pPVar12->ml_name = value->name;
  pPVar12->ml_meth = dispatcher;
  pPVar12->ml_flags = 3;
  capsule::capsule((capsule *)&local_c0,value,initialize_generic::anon_class_1_0_00000001::__invoke)
  ;
  local_80._M_dataplus._M_p = (pointer)0x0;
  pPVar14 = (value->scope).m_ptr;
  if (pPVar14 != (PyObject *)0x0) {
    iVar6 = PyObject_HasAttrString(pPVar14,"__module__");
    if (iVar6 == 1) {
      local_e8._8_8_ = (value->scope).m_ptr;
      local_d8._0_8_ = "__module__";
      local_d8._8_8_ = 0;
      poVar13 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e8);
    }
    else {
      iVar6 = PyObject_HasAttrString((value->scope).m_ptr,"__name__");
      if (iVar6 != 1) goto LAB_003d547a;
      local_e8._8_8_ = (value->scope).m_ptr;
      local_d8._0_8_ = "__name__";
      local_d8._8_8_ = 0;
      poVar13 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e8);
    }
    local_88.m_ptr = (poVar13->super_handle).m_ptr;
    if ((PyAsyncMethods *)local_88.m_ptr != (PyAsyncMethods *)0x0) {
      ((PyAsyncMethods *)local_88.m_ptr)->am_await =
           ((PyAsyncMethods *)local_88.m_ptr)->am_await + 1;
    }
    pybind11::object::operator=((object *)&local_80,(object *)&local_88);
    pybind11::object::~object((object *)&local_88);
    pybind11::object::~object((object *)(local_d8 + 8));
  }
LAB_003d547a:
  pPVar14 = (PyObject *)
            PyCMethod_New(value->def,local_c0._M_dataplus._M_p,local_80._M_dataplus._M_p,0);
  (local_98->super_function).super_object.super_handle.m_ptr = pPVar14;
  if (pPVar14 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object((object *)&local_80);
  pybind11::object::~object((object *)&local_c0);
  pfVar11 = value;
LAB_003d54b7:
  local_e8._0_8_ = local_d8;
  local_e8._8_8_ = (PyObject *)0x0;
  local_d8._0_8_ = local_d8._0_8_ & 0xffffffffffffff00;
  if ((pfVar24 != (function_record *)0x0) && (DAT_00744019 == '\x01')) {
    std::__cxx11::string::append(local_e8);
    std::__cxx11::string::append(local_e8);
    std::__cxx11::string::append(local_e8);
  }
  local_c8 = (PyBufferProcs *)((ulong)local_c8 & 0xffffffff00000000);
  local_90 = pfVar24;
  do {
    if (DAT_00744019 == '\x01') {
      if (pfVar24 != (function_record *)0x0) {
        uVar7 = (int)local_c8 + 1;
        local_c8 = (PyBufferProcs *)CONCAT44(local_c8._4_4_,uVar7);
        __val = -uVar7;
        if (0 < (int)uVar7) {
          __val = uVar7;
        }
        __len = 1;
        if (9 < __val) {
          uVar20 = (ulong)__val;
          uVar4 = 4;
          do {
            __len = uVar4;
            uVar8 = (uint)uVar20;
            if (uVar8 < 100) {
              __len = __len - 2;
              goto LAB_003d559e;
            }
            if (uVar8 < 1000) {
              __len = __len - 1;
              goto LAB_003d559e;
            }
            if (uVar8 < 10000) goto LAB_003d559e;
            uVar20 = uVar20 / 10000;
            uVar4 = __len + 4;
          } while (99999 < uVar8);
          __len = __len + 1;
        }
LAB_003d559e:
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_80,(char)__len - (char)((int)uVar7 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_80._M_dataplus._M_p + (uVar7 >> 0x1f),__len,__val);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_80);
        pfVar24 = local_90;
        value = local_a0;
        psVar21 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar21) {
          local_c0.field_2._M_allocated_capacity = *psVar21;
          local_c0.field_2._8_8_ = plVar15[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar21;
          local_c0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_c0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append(local_e8,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          (ulong)(local_80.field_2._M_allocated_capacity + 1));
        }
      }
      std::__cxx11::string::append(local_e8);
      std::__cxx11::string::append(local_e8);
      std::__cxx11::string::append(local_e8);
    }
    if (((pfVar11->doc != (char *)0x0) && (*pfVar11->doc != '\0')) &&
       (pybind11::options::global_state()::instance == '\x01')) {
      if (DAT_00744019 == '\x01') {
        std::__cxx11::string::append(local_e8);
      }
      std::__cxx11::string::append(local_e8);
      if (DAT_00744019 == '\x01') {
        std::__cxx11::string::append(local_e8);
      }
    }
    if (pfVar11->next != (function_record *)0x0) {
      std::__cxx11::string::append(local_e8);
    }
    pfVar11 = pfVar11->next;
    if (pfVar11 == (function_record *)0x0) {
      pPVar14 = (local_98->super_function).super_object.super_handle.m_ptr;
      __ptr = *(void **)(pPVar14[1].ob_refcnt + 0x18);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      pcVar9 = strdup((char *)local_e8._0_8_);
      *(char **)(pPVar14[1].ob_refcnt + 0x18) = pcVar9;
      if ((value->field_0x59 & 0x20) != 0) {
        pPVar16 = (PyObject *)
                  PyInstanceMethod_New((local_98->super_function).super_object.super_handle.m_ptr);
        (local_98->super_function).super_object.super_handle.m_ptr = pPVar16;
        if (pPVar16 == (PyObject *)0x0) {
          pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
        }
        pPVar14->ob_refcnt = pPVar14->ob_refcnt + -1;
        if (pPVar14->ob_refcnt == 0) {
          _Py_Dealloc(pPVar14);
        }
      }
      if ((undefined1 *)local_e8._0_8_ != local_d8) {
        operator_delete((void *)local_e8._0_8_,local_d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        /* Generate a proper function signature */
        std::string signature;
        size_t type_depth = 0, char_index = 0, type_index = 0, arg_index = 0;
        while (true) {
            char c = text[char_index++];
            if (c == '\0')
                break;

            if (c == '{') {
                // Write arg name for everything except *args, **kwargs and return type.
                if (type_depth == 0 && text[char_index] != '*' && arg_index < args) {
                    if (!rec->args.empty() && rec->args[arg_index].name) {
                        signature += rec->args[arg_index].name;
                    } else if (arg_index == 0 && rec->is_method) {
                        signature += "self";
                    } else {
                        signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                    }
                    signature += ": ";
                }
                ++type_depth;
            } else if (c == '}') {
                --type_depth;
                if (type_depth == 0) {
                    if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                        signature += "=";
                        signature += rec->args[arg_index].descr;
                    }
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
#if defined(PYPY_VERSION)
                    signature += handle((PyObject *) tinfo->type)
                                     .attr("__module__")
                                     .cast<std::string>() + ".";
#endif
                    signature += tinfo->type->tp_name;
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (type_depth != 0 || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

        #if !defined(PYBIND11_CPP14)
            delete[] types;
            delete[] text;
        #endif

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");
        rec->nargs = (std::uint16_t) args;

#if PY_MAJOR_VERSION < 3
        if (rec->sibling && PyMethod_Check(rec->sibling.ptr()))
            rec->sibling = PyMethod_GET_FUNCTION(rec->sibling.ptr());
#endif

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (chain->scope != rec->scope)
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(*dispatcher);
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](PyObject *o) {
                destruct((detail::function_record *) PyCapsule_GetPointer(o, nullptr));
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
            if (it->next)
                signatures += "\n";
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }